

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O2

set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
* dg::pta::reachableNodes
            (set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
             *__return_storage_ptr__,PSNode *nd)

{
  _Rb_tree_header *p_Var1;
  pointer ppPVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  pointer ppPVar5;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *__range3;
  pointer ppPVar6;
  pointer ppPVar7;
  pair<std::_Rb_tree_iterator<const_dg::pta::PSNode_*>,_bool> pVar8;
  _Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> local_88;
  _Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> local_68;
  pointer local_48;
  PSNode *succ;
  PSNode *nd_local;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  nd_local = nd;
  std::
  _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
  ::_M_insert_unique<dg::pta::PSNode_const*const&>
            ((_Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
              *)__return_storage_ptr__,&nd_local);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
            ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)&local_88,
             4);
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::push_back
            ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)&local_88,
             &nd_local);
  while( true ) {
    if (local_88._M_impl.super__Vector_impl_data._M_start ==
        local_88._M_impl.super__Vector_impl_data._M_finish) break;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
              ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
               &local_68,
               (long)local_88._M_impl.super__Vector_impl_data._M_finish -
               (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
    local_48 = local_88._M_impl.super__Vector_impl_data._M_finish;
    for (ppPVar7 = local_88._M_impl.super__Vector_impl_data._M_start;
        ppPVar5 = local_68._M_impl.super__Vector_impl_data._M_end_of_storage,
        ppPVar4 = local_68._M_impl.super__Vector_impl_data._M_finish,
        ppPVar3 = local_68._M_impl.super__Vector_impl_data._M_start, ppPVar7 != local_48;
        ppPVar7 = ppPVar7 + 1) {
      ppPVar2 = ((*ppPVar7)->super_SubgraphNode<dg::pta::PSNode>)._successors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppPVar6 = ((*ppPVar7)->super_SubgraphNode<dg::pta::PSNode>)._successors.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppPVar6 != ppPVar2;
          ppPVar6 = ppPVar6 + 1) {
        succ = *ppPVar6;
        pVar8 = std::
                _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
                ::_M_insert_unique<dg::pta::PSNode_const*const&>
                          ((_Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
                            *)__return_storage_ptr__,&succ);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::push_back
                    ((vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *)
                     &local_68,&succ);
        }
      }
    }
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start =
         local_88._M_impl.super__Vector_impl_data._M_start;
    local_68._M_impl.super__Vector_impl_data._M_finish =
         local_88._M_impl.super__Vector_impl_data._M_finish;
    local_88._M_impl.super__Vector_impl_data._M_start = ppPVar3;
    local_88._M_impl.super__Vector_impl_data._M_finish = ppPVar4;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar5;
    std::_Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::
    ~_Vector_base(&local_68);
  }
  std::_Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::
  ~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::set<const PSNode *> reachableNodes(const PSNode *nd) {
    std::set<const PSNode *> reachable;
    reachable.insert(nd);

    std::vector<const PSNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(nd);

    while (!to_process.empty()) {
        std::vector<const PSNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (const PSNode *cur : to_process) {
            for (const PSNode *succ : cur->successors()) {
                if (reachable.insert(succ).second)
                    new_to_process.push_back(succ);
            }
        }

        new_to_process.swap(to_process);
    }

    return reachable;
}